

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O0

int X509_STORE_CTX_get_by_subject(X509_STORE_CTX *vs,int type,X509_NAME *name,X509_OBJECT *ret)

{
  int iVar1;
  X509_LOOKUP *pXVar2;
  X509_LOOKUP *ctx_00;
  X509_LOOKUP *lu;
  size_t i;
  X509_OBJECT *tmp;
  X509_OBJECT stmp;
  X509_STORE *ctx;
  X509_OBJECT *ret_local;
  X509_NAME *name_local;
  int type_local;
  X509_STORE_CTX *vs_local;
  
  stmp.data = (anon_union_8_4_ca12f507_for_data)vs->ctx;
  CRYPTO_MUTEX_lock_write((CRYPTO_MUTEX *)&(stmp.data.x509)->sig_alg);
  i = (size_t)X509_OBJECT_retrieve_by_subject
                        ((stack_st_X509_OBJECT *)(stmp.data.x509)->cert_info,type,(X509_NAME *)name)
  ;
  CRYPTO_MUTEX_unlock_write((CRYPTO_MUTEX *)&(stmp.data.x509)->sig_alg);
  if (((X509_OBJECT *)i == (X509_OBJECT *)0x0) || (type == 2)) {
    for (lu = (X509_LOOKUP *)0x0;
        pXVar2 = (X509_LOOKUP *)sk_X509_LOOKUP_num((stack_st_X509_LOOKUP *)(stmp.data.x509)->skid),
        lu < pXVar2; lu = (X509_LOOKUP *)((long)&lu->method + 1)) {
      ctx_00 = (X509_LOOKUP *)
               sk_X509_LOOKUP_value((stack_st_X509_LOOKUP *)(stmp.data.x509)->skid,(size_t)lu);
      iVar1 = X509_LOOKUP_by_subject(ctx_00,type,(X509_NAME *)name,(X509_OBJECT *)&tmp);
      if (iVar1 != 0) {
        i = (size_t)&tmp;
        break;
      }
    }
    if (i == 0) {
      return 0;
    }
  }
  ret->type = *(int *)i;
  ret->data = *(anon_union_8_4_ca12f507_for_data *)(i + 8);
  X509_OBJECT_up_ref_count((X509_OBJECT *)ret);
  return 1;
}

Assistant:

int X509_STORE_CTX_get_by_subject(X509_STORE_CTX *vs, int type, X509_NAME *name,
                                  X509_OBJECT *ret) {
  X509_STORE *ctx = vs->ctx;
  X509_OBJECT stmp;
  CRYPTO_MUTEX_lock_write(&ctx->objs_lock);
  X509_OBJECT *tmp = X509_OBJECT_retrieve_by_subject(ctx->objs, type, name);
  CRYPTO_MUTEX_unlock_write(&ctx->objs_lock);

  if (tmp == NULL || type == X509_LU_CRL) {
    for (size_t i = 0; i < sk_X509_LOOKUP_num(ctx->get_cert_methods); i++) {
      X509_LOOKUP *lu = sk_X509_LOOKUP_value(ctx->get_cert_methods, i);
      if (X509_LOOKUP_by_subject(lu, type, name, &stmp)) {
        tmp = &stmp;
        break;
      }
    }
    if (tmp == NULL) {
      return 0;
    }
  }

  // TODO(crbug.com/boringssl/685): This should call
  // |X509_OBJECT_free_contents|.
  ret->type = tmp->type;
  ret->data = tmp->data;
  X509_OBJECT_up_ref_count(ret);
  return 1;
}